

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O2

HTMLElement * __thiscall
soul::HTMLGenerator::createNav(HTMLElement *__return_storage_ptr__,HTMLGenerator *this)

{
  HTMLElement *this_00;
  string_view value;
  string_view value_00;
  TableOfContentsNode local_80;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"nav",(allocator<char> *)&local_80);
  choc::html::HTMLElement::HTMLElement(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  value._M_str = "contents";
  value._M_len = 8;
  this_00 = choc::html::HTMLElement::setID(__return_storage_ptr__,value);
  value_00._M_str = "contents";
  value_00._M_len = 8;
  choc::html::HTMLElement::setClass(this_00,value_00);
  SourceCodeModel::createTableOfContentsRoot(&local_80,&this->model);
  printTOCNode(this,__return_storage_ptr__,&local_80,true);
  SourceCodeModel::TableOfContentsNode::~TableOfContentsNode(&local_80);
  return __return_storage_ptr__;
}

Assistant:

choc::html::HTMLElement createNav()
    {
        choc::html::HTMLElement nav ("nav");
        nav.setID ("contents").setClass ("contents");
        printTOCNode (nav, model.createTableOfContentsRoot(), true);
        return nav;
    }